

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMNontrappingFPToIntLowering.cpp
# Opt level: O2

void __thiscall
wasm::LLVMNonTrappingFPToIntLoweringImpl::replaceSigned<float,int>
          (LLVMNonTrappingFPToIntLoweringImpl *this,Unary *curr)

{
  BinaryOp op;
  uintptr_t uVar1;
  uint uVar2;
  Index index;
  UnaryOp UVar3;
  LocalSet *value;
  Unary *pUVar4;
  Const *pCVar5;
  Binary *condition;
  LocalGet *value_00;
  If *expression;
  ulong in_R8;
  optional<wasm::Type> type;
  Builder local_48;
  Builder builder;
  
  uVar2 = curr->op - TruncSatSFloat32ToInt32;
  if ((uVar2 < 7) && ((0x55U >> (uVar2 & 0x1f) & 1) != 0)) {
    UVar3 = *(UnaryOp *)(&DAT_00e172b0 + (ulong)uVar2 * 4);
    op = *(BinaryOp *)(&DAT_00e172e8 + (ulong)uVar2 * 4);
    builder.wasm = (Module *)
                   &(this->
                    super_WalkerPass<wasm::PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>_>
                    ).
                    super_PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
    ;
    local_48.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>_>
         ).
         super_PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
         .
         super_Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
         .currModule;
    index = Builder::addVar((this->
                            super_WalkerPass<wasm::PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>_>
                            ).
                            super_PostWalker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
                            .
                            super_Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
                            .currFunction,(Type)(curr->value->type).id);
    value = Builder::makeLocalTee(&local_48,index,curr->value,(Type)(curr->value->type).id);
    pUVar4 = Builder::makeUnary(&local_48,UVar3,(Expression *)value);
    pCVar5 = Builder::makeConst<float>(&local_48,2.1474836e+09);
    condition = Builder::makeBinary(&local_48,op,(Expression *)pUVar4,(Expression *)pCVar5);
    UVar3 = getReplacementOp(this,curr->op);
    uVar1 = (curr->value->type).id;
    value_00 = MixedArena::alloc<wasm::LocalGet>(&(local_48.wasm)->allocator);
    value_00->index = index;
    (value_00->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id = uVar1;
    pUVar4 = Builder::makeUnary(&local_48,UVar3,(Expression *)value_00);
    pCVar5 = Builder::makeConst<int>(&local_48,-0x80000000);
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)in_R8;
    expression = Builder::makeIf(&local_48,(Expression *)condition,(Expression *)pUVar4,
                                 (Expression *)pCVar5,type);
    Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
    ::replaceCurrent((Walker<wasm::LLVMNonTrappingFPToIntLoweringImpl,_wasm::Visitor<wasm::LLVMNonTrappingFPToIntLoweringImpl,_void>_>
                      *)builder.wasm,(Expression *)expression);
    return;
  }
  handle_unreachable("Unexpected opcode",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/LLVMNontrappingFPToIntLowering.cpp"
                     ,0x47);
}

Assistant:

void replaceSigned(Unary* curr) {
    BinaryOp ltOp;
    UnaryOp absOp;
    switch (curr->op) {
      case TruncSatSFloat32ToInt32:
      case TruncSatSFloat32ToInt64:
        ltOp = LtFloat32;
        absOp = AbsFloat32;
        break;
      case TruncSatSFloat64ToInt32:
      case TruncSatSFloat64ToInt64:
        ltOp = LtFloat64;
        absOp = AbsFloat64;
        break;
      default:
        WASM_UNREACHABLE("Unexpected opcode");
    }

    Builder builder(*getModule());
    Index v = Builder::addVar(getFunction(), curr->value->type);
    // if fabs(operand) < INT_MAX then use the trapping operation, else return
    // INT_MIN. The altnernate value is correct for the case where the input is
    // INT_MIN itself; otherwise it's UB so any value will do.
    replaceCurrent(builder.makeIf(
      builder.makeBinary(
        ltOp,
        builder.makeUnary(
          absOp, builder.makeLocalTee(v, curr->value, curr->value->type)),
        builder.makeConst(static_cast<From>(std::numeric_limits<To>::max()))),
      builder.makeUnary(getReplacementOp(curr->op),
                        builder.makeLocalGet(v, curr->value->type)),
      builder.makeConst(std::numeric_limits<To>::min())));
  }